

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThreads.cpp
# Opt level: O0

Value __thiscall xmrig::CpuThreads::toJSON(CpuThreads *this,Document *doc)

{
  bool bVar1;
  const_reference this_00;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *in_RSI;
  vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *in_RDI;
  Value VVar3;
  CpuThread *thread;
  const_iterator __end2;
  const_iterator __begin2;
  vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *__range2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *out;
  uint32_t in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint32_t uVar4;
  Document *in_stack_ffffffffffffff80;
  CpuThread *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  StringRefType *in_stack_ffffffffffffffa8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<const_xmrig::CpuThread_*,_std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>_>
  local_48;
  pointer *local_40;
  undefined1 local_21;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  
  local_20 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  local_21 = 0;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)in_RDI);
  if (*(int *)&(in_RSI->super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>).
               _M_impl.super__Vector_impl_data._M_start == 0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)in_RDI);
    local_40 = &(in_RSI->super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48._M_current =
         (CpuThread *)
         std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::begin
                   ((vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *)
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::end
              ((vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *)
               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_xmrig::CpuThread_*,_std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>_>
                               *)in_RDI,
                              (__normal_iterator<const_xmrig::CpuThread_*,_std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)),
          uVar2 = extraout_RDX, bVar1) {
      __gnu_cxx::
      __normal_iterator<const_xmrig::CpuThread_*,_std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>_>
      ::operator*(&local_48);
      CpuThread::toJSON(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_RDI,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x20296d);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&stack0xffffffffffffff98);
      __gnu_cxx::
      __normal_iterator<const_xmrig::CpuThread_*,_std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>_>
      ::operator++(&local_48);
    }
  }
  else {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    SetObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_RDI);
    rapidjson::StringRef<char>
              ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    bVar1 = std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::empty(in_RSI);
    if (bVar1) {
      uVar4 = 1;
    }
    else {
      this_00 = std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::front(in_RDI);
      in_stack_ffffffffffffff48 = CpuThread::intensity(this_00);
      uVar4 = in_stack_ffffffffffffff48;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
               (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffff98);
    rapidjson::StringRef<char>((char *)CONCAT44(uVar4,in_stack_ffffffffffffff48));
    std::vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>::size
              ((vector<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_> *)
               &(in_RSI->super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
               (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffff98);
    rapidjson::StringRef<char>((char *)CONCAT44(uVar4,in_stack_ffffffffffffff48));
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<long>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffff98);
    uVar2 = extraout_RDX_00;
  }
  VVar3.data_.s.str = (Ch *)uVar2;
  VVar3.data_.n = (Number)in_RDI;
  return (Value)VVar3.data_;
}

Assistant:

rapidjson::Value xmrig::CpuThreads::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out;

    if (m_format == ArrayFormat) {
        out.SetArray();

        for (const CpuThread &thread : m_data) {
            out.PushBack(thread.toJSON(doc), allocator);
        }
    }
    else {
        out.SetObject();

        out.AddMember(StringRef(kIntensity), m_data.empty() ? 1 : m_data.front().intensity(), allocator);
        out.AddMember(StringRef(kThreads), static_cast<unsigned>(m_data.size()), allocator);
        out.AddMember(StringRef(kAffinity), m_affinity, allocator);
    }

    return out;
}